

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O0

Ivy_Obj_t ** Ivy_ObjPrevNextFanoutPlace(Ivy_Obj_t *pObj,Ivy_Obj_t *pFanout)

{
  int iVar1;
  Ivy_Obj_t *pObj_00;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pTemp;
  Ivy_Obj_t *pFanout_local;
  Ivy_Obj_t *pObj_local;
  
  iVar1 = Ivy_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFanout.c"
                  ,0x52,"Ivy_Obj_t **Ivy_ObjPrevNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  iVar1 = Ivy_IsComplement(pFanout);
  if (iVar1 == 0) {
    pObj_00 = Ivy_ObjPrevFanout(pObj,pFanout);
    if (pObj_00 == (Ivy_Obj_t *)0x0) {
      pObj_local = (Ivy_Obj_t *)&pObj->pFanout;
    }
    else {
      pIVar2 = Ivy_ObjFanin0(pObj_00);
      if (pIVar2 == pObj) {
        pObj_local = (Ivy_Obj_t *)&pObj_00->pNextFan0;
      }
      else {
        pIVar2 = Ivy_ObjFanin1(pObj_00);
        if (pIVar2 != pObj) {
          __assert_fail("Ivy_ObjFanin1(pTemp) == pObj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFanout.c"
                        ,0x59,"Ivy_Obj_t **Ivy_ObjPrevNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
        }
        pObj_local = (Ivy_Obj_t *)&pObj_00->pNextFan1;
      }
    }
    return (Ivy_Obj_t **)pObj_local;
  }
  __assert_fail("!Ivy_IsComplement(pFanout)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFanout.c"
                ,0x53,"Ivy_Obj_t **Ivy_ObjPrevNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
}

Assistant:

static inline Ivy_Obj_t ** Ivy_ObjPrevNextFanoutPlace( Ivy_Obj_t * pObj, Ivy_Obj_t * pFanout )
{
    Ivy_Obj_t * pTemp;
    assert( !Ivy_IsComplement(pObj) );
    assert( !Ivy_IsComplement(pFanout) );
    pTemp = Ivy_ObjPrevFanout(pObj, pFanout);
    if ( pTemp == NULL )
        return &pObj->pFanout;
    if ( Ivy_ObjFanin0(pTemp) == pObj )
        return &pTemp->pNextFan0;
    assert( Ivy_ObjFanin1(pTemp) == pObj );
    return &pTemp->pNextFan1;
}